

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O3

void __thiscall re2::DFA::ResetCache(DFA *this,RWLocker *cache_lock)

{
  long lVar1;
  
  RWLocker::LockForWriting(cache_lock);
  lVar1 = 0xf0;
  do {
    *(undefined8 *)((long)this + lVar1 + -8) = 0;
    *(undefined4 *)((long)&this->prog_ + lVar1) = 0xffffffff;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x170);
  ClearCache(this);
  this->mem_budget_ = this->state_budget_;
  return;
}

Assistant:

void DFA::ResetCache(RWLocker* cache_lock) {
  // Re-acquire the cache_mutex_ for writing (exclusive use).
  cache_lock->LockForWriting();

  // Clear the cache, reset the memory budget.
  for (int i = 0; i < kMaxStart; i++) {
    start_[i].start = NULL;
    start_[i].first_byte.store(kFbUnknown, std::memory_order_relaxed);
  }
  ClearCache();
  mem_budget_ = state_budget_;
}